

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.h
# Opt level: O0

void __thiscall HFactor::~HFactor(HFactor *this)

{
  HVectorBase<double> *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  
  HVectorBase<double>::~HVectorBase(in_RDI);
  CLI::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  CLI::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  CLI::std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  CLI::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x180f36);
  CLI::std::unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_>::~unique_ptr
            ((unique_ptr<HFactor::LogData,_std::default_delete<HFactor::LogData>_> *)unaff_retaddr);
  RefactorInfo::~RefactorInfo((RefactorInfo *)in_RDI);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

HFactor()
      : build_realTick(0.0),
        build_synthetic_tick(0.0),
        rank_deficiency(0),
        basis_matrix_num_el(0),
        invert_num_el(0),
        kernel_dim(0),
        kernel_num_el(0),
        num_row(0),
        num_col(0),
        num_basic(0),
        a_matrix_valid(false),
        a_start(nullptr),
        a_index(nullptr),
        a_value(nullptr),
        basic_index(nullptr),
        pivot_threshold(0.0),
        pivot_tolerance(0.0),
        highs_debug_level(0),
        time_limit_(0.0),
        use_original_HFactor_logic(false),
        debug_report_(false),
        basis_matrix_limit_size(0),
        update_method(0),
        build_timer_(nullptr),
        nwork(0),
        u_merit_x(0),
        // clang-format off
        u_total_x(0) {}